

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_graph_algorithms.cpp
# Opt level: O0

unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
* geometrycentral::surface::vertexDijkstraDistanceWithinRadius
            (IntrinsicGeometryInterface *geom,Vertex startVert,double ballRad)

{
  Edge e_00;
  Vertex v;
  bool bVar1;
  NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> *this;
  __tuple_element_t<0UL,_tuple<double,_Vertex>_> *p_Var2;
  __tuple_element_t<1UL,_tuple<double,_Vertex>_> *p_Var3;
  _Node_iterator_base<std::pair<const_geometrycentral::surface::Vertex,_double>,_true> _Var4;
  ParentMeshT *pPVar5;
  long in_RSI;
  unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
  *in_RDI;
  double in_XMM0_Qa;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> EVar6;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> EVar7;
  double targetDist;
  Vertex targetVert;
  double len;
  Edge e;
  NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> __end3;
  NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> __begin3;
  NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> *__range3;
  Vertex currVert;
  double currDist;
  priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
  toProcess;
  SurfaceMesh *mesh;
  unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
  *shortestDist;
  NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>
  *in_stack_fffffffffffffd98;
  _Node_iterator_base<std::pair<const_geometrycentral::surface::Vertex,_double>,_true>
  in_stack_fffffffffffffda0;
  bool local_251;
  Vertex *in_stack_fffffffffffffdb0;
  ParentMeshT *in_stack_fffffffffffffdb8;
  priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
  *in_stack_fffffffffffffdc0;
  Edge *this_00;
  _Node_iterator_base<std::pair<const_geometrycentral::surface::Vertex,_double>,_true>
  in_stack_fffffffffffffe20;
  _Node_iterator_base<std::pair<const_geometrycentral::surface::Vertex,_double>,_true> local_1d8;
  double local_1d0;
  ParentMeshT *local_1c8;
  size_t sStack_1c0;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_1b8;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_1a8;
  pointer local_190;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_188;
  undefined1 local_108 [104];
  undefined1 *local_a0;
  _Node_iterator_base<std::pair<const_geometrycentral::surface::Vertex,_double>,_true> local_98;
  _Node_iterator_base<std::pair<const_geometrycentral::surface::Vertex,_double>,_true> local_90;
  ParentMeshT *local_88;
  size_t sStack_80;
  Edge *local_78;
  undefined8 local_70;
  byte local_31;
  undefined8 local_30;
  double local_28;
  
  local_30 = *(undefined8 *)(in_RSI + 8);
  local_28 = in_XMM0_Qa;
  IntrinsicGeometryInterface::requireEdgeLengths((IntrinsicGeometryInterface *)0x2def61);
  local_31 = 0;
  ::std::
  unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
  ::unordered_map((unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
                   *)0x2def76);
  ::std::
  priority_queue<std::tuple<double,geometrycentral::surface::Vertex>,std::vector<std::tuple<double,geometrycentral::surface::Vertex>,std::allocator<std::tuple<double,geometrycentral::surface::Vertex>>>,std::greater<std::tuple<double,geometrycentral::surface::Vertex>>>
  ::
  priority_queue<std::vector<std::tuple<double,geometrycentral::surface::Vertex>,std::allocator<std::tuple<double,geometrycentral::surface::Vertex>>>,void>
            ((priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
              *)in_stack_fffffffffffffda0._M_cur);
  local_70 = 0;
  ::std::
  priority_queue<std::tuple<double,geometrycentral::surface::Vertex>,std::vector<std::tuple<double,geometrycentral::surface::Vertex>,std::allocator<std::tuple<double,geometrycentral::surface::Vertex>>>,std::greater<std::tuple<double,geometrycentral::surface::Vertex>>>
  ::emplace<double,geometrycentral::surface::Vertex&>
            (in_stack_fffffffffffffdc0,(double *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0
            );
  EVar7.ind = (size_t)in_stack_fffffffffffffdb0;
  EVar7.mesh = in_stack_fffffffffffffdb8;
  while( true ) {
    bVar1 = ::std::
            priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
            ::empty((priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
                     *)0x2defbf);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this = (NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> *)
           ::std::
           priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
           ::top((priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
                  *)0x2defe1);
    p_Var2 = ::std::get<0ul,double,geometrycentral::surface::Vertex>
                       ((tuple<double,_geometrycentral::surface::Vertex> *)0x2deff2);
    local_78 = (Edge *)*p_Var2;
    ::std::
    priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
    ::top((priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
           *)0x2df00c);
    p_Var3 = ::std::get<1ul,double,geometrycentral::surface::Vertex>
                       ((tuple<double,_geometrycentral::surface::Vertex> *)0x2df01d);
    local_88 = (p_Var3->
               super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
               ).mesh;
    sStack_80 = (p_Var3->
                super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                ).ind;
    ::std::
    priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
    ::pop((priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
           *)EVar7.ind);
    _Var4._M_cur = (__node_type *)
                   ::std::
                   unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
                   ::find((unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
                           *)in_stack_fffffffffffffd98,(key_type *)0x2df04e);
    local_90._M_cur = _Var4._M_cur;
    local_98._M_cur =
         (__node_type *)
         ::std::
         unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
         ::end((unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
                *)in_stack_fffffffffffffd98);
    bVar1 = ::std::__detail::operator!=(&local_90,&local_98);
    if (!bVar1) {
      this_00 = local_78;
      pPVar5 = (ParentMeshT *)
               ::std::
               unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
               ::operator[]((unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
                             *)in_stack_fffffffffffffda0._M_cur,
                            (key_type *)in_stack_fffffffffffffd98);
      pPVar5->_vptr_SurfaceMesh = (_func_int **)this_00;
      Vertex::adjacentEdges((Vertex *)in_stack_fffffffffffffe20._M_cur);
      local_a0 = local_108;
      NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>::begin(this);
      NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>::end
                ((NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> *)
                 in_stack_fffffffffffffda0._M_cur);
      while( true ) {
        bVar1 = NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>::
                operator!=((NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>
                            *)in_stack_fffffffffffffda0._M_cur,in_stack_fffffffffffffd98);
        if (!bVar1) break;
        EVar6 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
                NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>::
                operator*((NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>
                           *)0x2df19c);
        e_00.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
        ind = (size_t)in_stack_fffffffffffffdc0;
        e_00.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
        mesh = EVar7.mesh;
        local_1a8 = EVar6;
        local_188 = EVar6;
        in_stack_fffffffffffffdc0 =
             (priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
              *)MeshData<geometrycentral::surface::Edge,_double>::operator[]
                          ((MeshData<geometrycentral::surface::Edge,_double> *)EVar7.ind,e_00);
        local_190 = (in_stack_fffffffffffffdc0->c).
                    super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_1c8 = local_88;
        sStack_1c0 = sStack_80;
        v.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
             = (size_t)_Var4._M_cur;
        v.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
        mesh = pPVar5;
        EVar7 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
                Edge::otherVertex(this_00,v);
        local_1d0 = (double)local_78 + (double)local_190;
        local_251 = false;
        local_1b8 = EVar7;
        if (local_1d0 <= local_28) {
          in_stack_fffffffffffffda0._M_cur =
               (__node_type *)
               ::std::
               unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
               ::find((unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
                       *)in_stack_fffffffffffffd98,(key_type *)0x2df2b4);
          local_1d8._M_cur = in_stack_fffffffffffffda0._M_cur;
          in_stack_fffffffffffffe20._M_cur =
               (__node_type *)
               ::std::
               unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
               ::end((unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
                      *)in_stack_fffffffffffffd98);
          local_251 = ::std::__detail::operator==
                                (&local_1d8,
                                 (_Node_iterator_base<std::pair<const_geometrycentral::surface::Vertex,_double>,_true>
                                  *)&stack0xfffffffffffffe20);
        }
        if (local_251 != false) {
          ::std::
          priority_queue<std::tuple<double,geometrycentral::surface::Vertex>,std::vector<std::tuple<double,geometrycentral::surface::Vertex>,std::allocator<std::tuple<double,geometrycentral::surface::Vertex>>>,std::greater<std::tuple<double,geometrycentral::surface::Vertex>>>
          ::emplace<double&,geometrycentral::surface::Vertex&>
                    (in_stack_fffffffffffffdc0,(double *)EVar7.mesh,(Vertex *)EVar7.ind);
        }
        NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>::operator++
                  ((NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> *)
                   in_stack_fffffffffffffda0._M_cur);
      }
    }
  }
  local_31 = 1;
  ::std::
  priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
  ::~priority_queue((priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
                     *)0x2df351);
  if ((local_31 & 1) == 0) {
    ::std::
    unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
    ::~unordered_map((unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
                      *)0x2df368);
  }
  return in_RDI;
}

Assistant:

std::unordered_map<Vertex, double> vertexDijkstraDistanceWithinRadius(IntrinsicGeometryInterface& geom,
                                                                      Vertex startVert, double ballRad) {

  // Gather values
  SurfaceMesh& mesh = geom.mesh;
  geom.requireEdgeLengths();

  // Search state: incoming halfedges to each vertex, once discovered
  std::unordered_map<Vertex, double> shortestDist;

  // Search state: visible neighbors eligible to expand to
  using WeightedVertex = std::tuple<double, Vertex>;
  std::priority_queue<WeightedVertex, std::vector<WeightedVertex>, std::greater<WeightedVertex>> toProcess;

  // Add initial source
  toProcess.emplace(0., startVert);

  while (!toProcess.empty()) {

    // Get the next closest neighbor off the queue
    double currDist = std::get<0>(toProcess.top());
    Vertex currVert = std::get<1>(toProcess.top());
    toProcess.pop();

    // skips stale entries
    if (shortestDist.find(currVert) != shortestDist.end()) continue;

    shortestDist[currVert] = currDist;

    for (Edge e : currVert.adjacentEdges()) {
      double len = geom.edgeLengths[e];
      Vertex targetVert = e.otherVertex(currVert);
      double targetDist = currDist + len;

      if (targetDist <= ballRad && shortestDist.find(targetVert) == shortestDist.end()) {
        toProcess.emplace(targetDist, targetVert);
      }
    }
  }

  return shortestDist;
}